

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O2

double floatvalue(svalue_t *v)

{
  int iVar1;
  double dVar2;
  
  iVar1 = v->type;
  if (iVar1 == 6) {
    return (double)(v->value).i * 1.52587890625e-05;
  }
  if (iVar1 != 2) {
    if (iVar1 == 0) {
      dVar2 = atof((v->string).Chars);
      return dVar2;
    }
    return (double)(v->value).i;
  }
  return -1.0;
}

Assistant:

double floatvalue(const svalue_t &v)
{
	return 
		v.type == svt_string ? atof(v.string) :       
		v.type == svt_fixed ? v.value.f / 65536. : 
		v.type == svt_mobj ? -1. : (double)v.value.i;
}